

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OscReceivedElements.cpp
# Opt level: O1

bool __thiscall osc::ReceivedMessageArgument::AsBoolUnchecked(ReceivedMessageArgument *this)

{
  undefined8 *puVar1;
  
  if (this->typeTagPtr_ != (char *)0x0) {
    return *this->typeTagPtr_ == 'T';
  }
  puVar1 = (undefined8 *)__cxa_allocate_exception(0x10);
  puVar1[1] = "missing argument";
  *puVar1 = &PTR__exception_00179c90;
  __cxa_throw(puVar1,&MissingArgumentException::typeinfo,std::exception::~exception);
}

Assistant:

bool ReceivedMessageArgument::AsBoolUnchecked() const
{
    if( !typeTagPtr_ )
        throw MissingArgumentException();
	else if( *typeTagPtr_ == TRUE_TYPE_TAG )
		return true;
    else
	    return false;
}